

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

void StoreHuffmanTreeOfHuffmanTreeToBitMask(VP8LBitWriter *bw,uint8_t *code_length_bitdepth)

{
  VP8LBitWriter *in_RSI;
  int codes_to_store;
  int i;
  int n_bits;
  uint32_t in_stack_ffffffffffffffec;
  uint32_t bits;
  
  n_bits = 0x13;
  while ((4 < n_bits && (*(char *)((long)&in_RSI->bits + (ulong)"\x11\x12"[n_bits + -1]) == '\0')))
  {
    n_bits = n_bits + -1;
  }
  VP8LPutBits(in_RSI,in_stack_ffffffffffffffec,n_bits);
  for (bits = 0; (int)bits < n_bits; bits = bits + 1) {
    VP8LPutBits(in_RSI,bits,n_bits);
  }
  return;
}

Assistant:

static void StoreHuffmanTreeOfHuffmanTreeToBitMask(
    VP8LBitWriter* const bw, const uint8_t* code_length_bitdepth) {
  // RFC 1951 will calm you down if you are worried about this funny sequence.
  // This sequence is tuned from that, but more weighted for lower symbol count,
  // and more spiking histograms.
  static const uint8_t kStorageOrder[CODE_LENGTH_CODES] = {
    17, 18, 0, 1, 2, 3, 4, 5, 16, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15
  };
  int i;
  // Throw away trailing zeros:
  int codes_to_store = CODE_LENGTH_CODES;
  for (; codes_to_store > 4; --codes_to_store) {
    if (code_length_bitdepth[kStorageOrder[codes_to_store - 1]] != 0) {
      break;
    }
  }
  VP8LPutBits(bw, codes_to_store - 4, 4);
  for (i = 0; i < codes_to_store; ++i) {
    VP8LPutBits(bw, code_length_bitdepth[kStorageOrder[i]], 3);
  }
}